

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::Decode(S2Loop *this,Decoder *decoder)

{
  uchar uVar1;
  bool bVar2;
  size_t sVar3;
  
  sVar3 = Decoder::avail(decoder);
  if ((sVar3 != 0) && (uVar1 = *decoder->buf_, decoder->buf_ = decoder->buf_ + 1, uVar1 == '\x01'))
  {
    bVar2 = DecodeInternal(this,decoder,false);
    return bVar2;
  }
  return false;
}

Assistant:

bool S2Loop::Decode(Decoder* const decoder) {
  if (decoder->avail() < sizeof(unsigned char)) return false;
  unsigned char version = decoder->get8();
  switch (version) {
    case kCurrentLosslessEncodingVersionNumber:
      return DecodeInternal(decoder, false);
  }
  return false;
}